

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_permute_cols(m2v *M,int *colperm)

{
  uint uVar1;
  ulong uVar2;
  int c1;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *__s;
  undefined8 uStack_60;
  char acStack_58 [8];
  undefined1 local_50 [8];
  m2v colbuf_mat;
  ulong uVar3;
  
  uVar1 = M->n_col;
  lVar4 = -((ulong)uVar1 + 0xf & 0xfffffffffffffff0);
  __s = acStack_58 + lVar4;
  if (0 < (int)uVar1) {
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x102851;
    memset(__s,0,(ulong)uVar1);
  }
  lVar4 = (long)__s - ((ulong)(uint)M->n_row * 4 + 0xf & 0xfffffffffffffff0);
  local_50._0_4_ = M->n_row;
  local_50._4_4_ = 1;
  colbuf_mat.n_row = 1;
  colbuf_mat._8_8_ = lVar4;
  if (0 < M->n_col) {
    uVar6 = 0;
    colbuf_mat.e = (m2v_base *)colperm;
    do {
      if (__s[uVar6] == '\0') {
        if (uVar6 == ((m2v_base *)colperm)[uVar6]) {
          __s[uVar6] = '\x01';
        }
        else {
          c1 = (int)uVar6;
          *(undefined8 *)(lVar4 + -8) = 0x1028bc;
          m2v_copy_col(M,c1,(m2v *)local_50,0);
          if (uVar6 != ((m2v_base *)colperm)[uVar6]) {
            uVar2 = (ulong)((m2v_base *)colperm)[uVar6];
            uVar5 = uVar6 & 0xffffffff;
            do {
              uVar3 = uVar2;
              c1 = (int)uVar3;
              __s[c1] = '\x01';
              *(undefined8 *)(lVar4 + -8) = 0x1028ec;
              m2v_copy_col(M,c1,M,(int)uVar5);
              uVar2 = (ulong)colbuf_mat.e[c1];
              uVar5 = uVar3;
              colperm = (int *)colbuf_mat.e;
            } while (uVar6 != colbuf_mat.e[c1]);
          }
          __s[uVar6] = '\x01';
          *(undefined8 *)(lVar4 + -8) = 0x10291e;
          m2v_copy_col((m2v *)local_50,0,M,c1);
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)M->n_col);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_cols)(MV_GEN_TYPE* M, const int* colperm)
{
	char visited[M->n_col];
	for (int i = 0; i < M->n_col; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(colbuf_mat, colbuf, M->n_row, 1);
	for (int i = 0; i < M->n_col; ++i) {
		if (visited[i])
			continue;
		if (colperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_col)(M, i, &colbuf_mat, 0);
		int e = i, e_next = colperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_col)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = colperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_col)(&colbuf_mat, 0, M, e);
	}
}